

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O0

void Sfm_TimEdgeArrival(Sfm_Tim_t *p,Mio_Pin_t *pPin,int *pTimeIn,int *pTimeOut)

{
  Mio_PinPhase_t MVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  int tDelayBlockFall;
  int tDelayBlockRise;
  Mio_PinPhase_t PinPhase;
  int *pTimeOut_local;
  int *pTimeIn_local;
  Mio_Pin_t *pPin_local;
  Sfm_Tim_t *p_local;
  
  MVar1 = Mio_PinReadPhase(pPin);
  dVar5 = Mio_PinReadDelayBlockRise(pPin);
  iVar2 = Scl_Flt2Int((float)dVar5);
  dVar5 = Mio_PinReadDelayBlockFall(pPin);
  iVar3 = Scl_Flt2Int((float)dVar5);
  if (MVar1 != MIO_PHASE_INV) {
    iVar4 = Abc_MaxInt(*pTimeOut,*pTimeIn + iVar2);
    *pTimeOut = iVar4;
    iVar4 = Abc_MaxInt(pTimeOut[1],pTimeIn[1] + iVar3);
    pTimeOut[1] = iVar4;
  }
  if (MVar1 != MIO_PHASE_NONINV) {
    iVar2 = Abc_MaxInt(*pTimeOut,pTimeIn[1] + iVar2);
    *pTimeOut = iVar2;
    iVar2 = Abc_MaxInt(pTimeOut[1],*pTimeIn + iVar3);
    pTimeOut[1] = iVar2;
  }
  return;
}

Assistant:

static inline void Sfm_TimEdgeArrival( Sfm_Tim_t * p, Mio_Pin_t * pPin, int * pTimeIn, int * pTimeOut )
{
    Mio_PinPhase_t PinPhase = Mio_PinReadPhase(pPin);
    int tDelayBlockRise = Scl_Flt2Int(Mio_PinReadDelayBlockRise(pPin));  
    int tDelayBlockFall = Scl_Flt2Int(Mio_PinReadDelayBlockFall(pPin));  
    if ( PinPhase != MIO_PHASE_INV )  // NONINV phase is present
    {
        pTimeOut[0] = Abc_MaxInt( pTimeOut[0], pTimeIn[0] + tDelayBlockRise );
        pTimeOut[1] = Abc_MaxInt( pTimeOut[1], pTimeIn[1] + tDelayBlockFall );
    }
    if ( PinPhase != MIO_PHASE_NONINV )  // INV phase is present
    {
        pTimeOut[0] = Abc_MaxInt( pTimeOut[0], pTimeIn[1] + tDelayBlockRise );
        pTimeOut[1] = Abc_MaxInt( pTimeOut[1], pTimeIn[0] + tDelayBlockFall );
    }
}